

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

Tour * tour_create(Tour *__return_storage_ptr__,Instance *instance)

{
  int32_t *piVar1;
  Tour *result;
  Instance *instance_local;
  
  memset(__return_storage_ptr__,0,0x18);
  __return_storage_ptr__->num_customers = instance->num_customers;
  __return_storage_ptr__->num_comps = 0;
  piVar1 = veci32_create(instance->num_customers + 1);
  __return_storage_ptr__->succ = piVar1;
  piVar1 = veci32_create(instance->num_customers + 1);
  __return_storage_ptr__->comp = piVar1;
  tour_clear(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Tour tour_create(const Instance *instance) {
    Tour result = {0};
    result.num_customers = instance->num_customers;

    result.num_comps = 0;
    result.succ = veci32_create(instance->num_customers + 1);
    result.comp = veci32_create(instance->num_customers + 1);

    tour_clear(&result);
    return result;
}